

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::Init(Error *__return_storage_ptr__,JobManager *this,Config *aConf)

{
  ErrorCode EVar1;
  Error *pEVar2;
  undefined1 auStack_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  Config::operator=(&this->mDefaultConf,aConf);
  security_material::Init((Error *)auStack_48,aConf);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)auStack_48);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(auStack_48 + 8));
  if (EVar1 == kNone) {
    CommissionerAppCreate((Error *)auStack_48,&this->mDefaultCommissioner,aConf);
    Error::operator=(__return_storage_ptr__,(Error *)auStack_48);
    std::__cxx11::string::~string((string *)(auStack_48 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::Init(const Config &aConf)
{
    Error error;

    mDefaultConf = aConf;
    SuccessOrExit(error = security_material::Init(aConf));
    SuccessOrExit(error = CommissionerAppCreate(mDefaultCommissioner, aConf));
exit:
    return error;
}